

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngfix.c
# Opt level: O1

int zlib_run(zlib *zlib)

{
  png_uint_32 *ppVar1;
  uint uVar2;
  uint uVar3;
  IDAT *pIVar4;
  IDAT_list *pIVar5;
  chunk *pcVar6;
  bool bVar7;
  int iVar8;
  IDAT_list *pIVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  int unaff_EBP;
  png_uint_32 nbytes;
  ulong uVar13;
  IDAT_list *pIVar14;
  ulong uVar15;
  
  zlib->extra_bytes = 0;
  pIVar4 = zlib->idat;
  uVar2 = zlib->rewrite_offset;
  if (pIVar4 == (IDAT *)0x0) {
    pcVar6 = zlib->chunk;
    uVar3 = pcVar6->chunk_length;
    nbytes = uVar3 - uVar2;
    if (uVar3 < uVar2 || nbytes == 0) {
      __assert_fail("zlib->rewrite_offset < chunk->chunk_length",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctruta[P]libpng/contrib/tools/pngfix.c"
                    ,0xa16,"int zlib_run(struct zlib *)");
    }
    unaff_EBP = zlib_advance(zlib,nbytes);
    ppVar1 = &pcVar6->chunk_length;
    *ppVar1 = *ppVar1 - zlib->extra_bytes;
  }
  else {
    if (uVar2 != 0) {
      __assert_fail("zlib->rewrite_offset == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctruta[P]libpng/contrib/tools/pngfix.c"
                    ,0x9c4,"int zlib_run(struct zlib *)");
    }
    pIVar5 = pIVar4->idat_list_tail;
    pIVar14 = pIVar4->idat_list_head;
    iVar8 = 0;
    do {
      uVar15 = (ulong)pIVar14->count;
      if (uVar15 != 0) {
        bVar7 = iVar8 != 0;
        uVar13 = 0;
        do {
          if (bVar7) {
            skip_12(zlib->file);
          }
          iVar8 = zlib_advance(zlib,pIVar14->lengths[uVar13]);
          if (iVar8 == 0) {
            iVar10 = 0;
          }
          else {
            if (iVar8 == 1) {
              if (((undefined1  [96])((undefined1  [96])*zlib->global & (undefined1  [96])0x1) !=
                   (undefined1  [96])0x0) && (zlib->extra_bytes == 0)) {
                iVar10 = (int)uVar13 + 1;
                pIVar9 = pIVar14;
                uVar12 = uVar15;
                while( true ) {
                  if (iVar10 < (int)uVar12) {
                    lVar11 = (long)iVar10;
                    do {
                      if (pIVar9->lengths[lVar11] != 0) {
                        type_message(zlib->chunk->file,zlib->chunk->chunk_type,
                                     "extra compressed data");
                        iVar10 = 0xd;
                        goto LAB_00106bc0;
                      }
                      lVar11 = lVar11 + 1;
                    } while ((int)uVar12 != lVar11);
                  }
                  if (pIVar9 == pIVar5) break;
                  pIVar9 = pIVar9->next;
                  uVar12 = (ulong)pIVar9->count;
                  iVar10 = 0;
                }
                iVar10 = 0;
LAB_00106bc0:
                if ((iVar10 != 0xd) && (iVar10 != 0)) goto LAB_00106b61;
              }
              pIVar14->lengths[uVar13] = pIVar14->lengths[uVar13] - zlib->extra_bytes;
              pIVar14->count = (int)uVar13 + 1;
              zlib->idat->idat_list_tail = pIVar14;
            }
            iVar10 = 1;
            unaff_EBP = iVar8;
          }
LAB_00106b61:
          if (iVar10 != 0) {
            iVar8 = 0xc;
            bVar7 = false;
            goto LAB_00106bf7;
          }
          uVar13 = uVar13 + 1;
          bVar7 = true;
        } while (uVar13 != uVar15);
        iVar8 = 0xc;
      }
      if (pIVar14 == pIVar5) {
        bVar7 = false;
        unaff_EBP = 0;
      }
      else {
        pIVar14 = pIVar14->next;
        bVar7 = true;
      }
LAB_00106bf7:
    } while (bVar7);
  }
  return unaff_EBP;
}

Assistant:

static int
zlib_run(struct zlib *zlib)
   /* Like zlib_advance but also handles a stream of IDAT chunks. */
{
   /* The 'extra_bytes' field is set by zlib_advance if there is extra
    * compressed data in the chunk it handles (if it sees Z_STREAM_END before
    * all the input data has been used.)  This function uses the value to update
    * the correct chunk length, so the problem should only ever be detected once
    * for each chunk.  zlib_advance outputs the error message, though see the
    * IDAT specific check below.
    */
   zlib->extra_bytes = 0;

   if (zlib->idat != NULL)
   {
      struct IDAT_list *list = zlib->idat->idat_list_head;
      struct IDAT_list *last = zlib->idat->idat_list_tail;
      int        skip = 0;

      /* 'rewrite_offset' is the offset of the LZ data within the chunk, for
       * IDAT it should be 0:
       */
      assert(zlib->rewrite_offset == 0);

      /* Process each IDAT_list in turn; the caller has left the stream
       * positioned at the start of the first IDAT chunk data.
       */
      for (;;)
      {
         unsigned int count = list->count;
         unsigned int i;

         for (i = 0; i<count; ++i)
         {
            int rc;

            if (skip > 0) /* Skip CRC and next IDAT header */
               skip_12(zlib->file);

            skip = 12; /* for the next time */

            rc = zlib_advance(zlib, list->lengths[i]);

            switch (rc)
            {
               case ZLIB_OK: /* keep going */
                  break;

               case ZLIB_STREAM_END: /* stop */
                  /* There may be extra chunks; if there are and one of them is
                   * not zero length output the 'extra data' message.  Only do
                   * this check if errors are being output.
                   */
                  if (zlib->global->errors && zlib->extra_bytes == 0)
                  {
                     struct IDAT_list *check = list;
                     int j = i+1, jcount = count;

                     for (;;)
                     {
                        for (; j<jcount; ++j)
                           if (check->lengths[j] > 0)
                           {
                              chunk_message(zlib->chunk,
                                 "extra compressed data");
                              goto end_check;
                           }

                        if (check == last)
                           break;

                        check = check->next;
                        jcount = check->count;
                        j = 0;
                     }
                  }

               end_check:
                  /* Terminate the list at the current position, reducing the
                   * length of the last IDAT too if required.
                   */
                  list->lengths[i] -= zlib->extra_bytes;
                  list->count = i+1;
                  zlib->idat->idat_list_tail = list;
                  /* FALLTHROUGH */

               default:
                  return rc;
            }
         }

         /* At the end of the compressed data and Z_STREAM_END was not seen. */
         if (list == last)
            return ZLIB_OK;

         list = list->next;
      }
   }

   else
   {
      struct chunk *chunk = zlib->chunk;
      int rc;

      assert(zlib->rewrite_offset < chunk->chunk_length);

      rc = zlib_advance(zlib, chunk->chunk_length - zlib->rewrite_offset);

      /* The extra bytes in the chunk are handled now by adjusting the chunk
       * length to exclude them; the zlib data is always stored at the end of
       * the PNG chunk (although clearly this is not necessary.)  zlib_advance
       * has already output a warning message.
       */
      chunk->chunk_length -= zlib->extra_bytes;
      return rc;
   }
}